

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O2

void __thiscall sf2cute::RIFF::set_name(RIFF *this,string *name)

{
  ostream *poVar1;
  invalid_argument *this_00;
  string local_1b0 [32];
  ostringstream message_builder;
  
  if (name->_M_string_length == 4) {
    std::__cxx11::string::operator=((string *)&this->name_,(string *)name);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_builder);
  poVar1 = std::operator<<((ostream *)&message_builder,"Invalid RIFF form type \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\".");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RIFF::set_name(std::string name) {
  // Throw exception if the length of form type is not 4.
  if (name.size() != 4) {
    std::ostringstream message_builder;
    message_builder << "Invalid RIFF form type \"" << name << "\".";
    throw std::invalid_argument(message_builder.str());
  }

  // Set the name.
  name_ = std::move(name);
}